

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::DescriptorProto::_InternalSerialize
          (DescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  MessageOptions *value;
  _func_int **pp_Var1;
  DescriptorProto *pDVar2;
  ptrdiff_t pVar3;
  uint32_t num;
  bool bVar4;
  int iVar5;
  SymbolVisibility value_00;
  uint32_t *puVar6;
  char *pcVar7;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar8;
  const_reference pFVar9;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  const_reference this_01;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_02;
  const_reference this_03;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_04;
  const_reference this_05;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *this_06;
  const_reference this_07;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *this_08;
  const_reference this_09;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_10;
  void *__src;
  UnknownFieldSet *unknown_fields;
  byte *__dest;
  string_view s_00;
  string_view local_138;
  const_reference local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int n_7;
  int i_7;
  DescriptorProto_ReservedRange *repfield_6;
  uint n_6;
  uint i_6;
  OneofDescriptorProto *repfield_5;
  uint n_5;
  uint i_5;
  FieldDescriptorProto *repfield_4;
  uint n_4;
  uint i_4;
  DescriptorProto_ExtensionRange *repfield_3;
  uint n_3;
  uint i_3;
  EnumDescriptorProto *repfield_2;
  uint n_2;
  uint i_2;
  DescriptorProto *repfield_1;
  uint n_1;
  uint i_1;
  FieldDescriptorProto *repfield;
  uint n;
  uint i;
  char *local_a0;
  string_view local_98;
  string *local_88;
  string *_s;
  DescriptorProto *pDStack_78;
  uint32_t cached_has_bits;
  DescriptorProto *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  DescriptorProto *this_local;
  char *local_50;
  size_t local_48;
  ptrdiff_t size;
  const_reference local_38;
  uint32_t local_2c;
  DescriptorProto *local_28;
  EpsCopyOutputStream *local_20;
  byte *local_18;
  uint local_c;
  
  _s._4_4_ = 0;
  pDStack_78 = this;
  this_ = (DescriptorProto *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar6 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar6;
  if ((_s._4_4_ & 1) != 0) {
    local_88 = _internal_name_abi_cxx11_(pDStack_78);
    pcVar7 = (char *)std::__cxx11::string::data();
    iVar5 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,"google.protobuf.DescriptorProto.name");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar7,iVar5,SERIALIZE,local_98);
    pDVar2 = this_;
    _n = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pDVar2,1,_n,(uint8_t *)stream_local);
  }
  repfield._4_4_ = 0;
  repfield._0_4_ = _internal_field_size(pDStack_78);
  for (; repfield._4_4_ < (uint)repfield; repfield._4_4_ = repfield._4_4_ + 1) {
    pRVar8 = _internal_field(pDStack_78);
    pFVar9 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Get(pRVar8,repfield._4_4_);
    _n_1 = pFVar9;
    iVar5 = FieldDescriptorProto::GetCachedSize(pFVar9);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)pFVar9,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_1._4_4_ = 0;
  repfield_1._0_4_ = _internal_nested_type_size(pDStack_78);
  for (; repfield_1._4_4_ < (uint)repfield_1; repfield_1._4_4_ = repfield_1._4_4_ + 1) {
    this_00 = _internal_nested_type(pDStack_78);
    this_01 = RepeatedPtrField<google::protobuf::DescriptorProto>::Get(this_00,repfield_1._4_4_);
    _n_2 = this_01;
    iVar5 = GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)this_01,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_2._4_4_ = 0;
  repfield_2._0_4_ = _internal_enum_type_size(pDStack_78);
  for (; repfield_2._4_4_ < (uint)repfield_2; repfield_2._4_4_ = repfield_2._4_4_ + 1) {
    this_02 = _internal_enum_type(pDStack_78);
    this_03 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Get(this_02,repfield_2._4_4_)
    ;
    _n_3 = this_03;
    iVar5 = EnumDescriptorProto::GetCachedSize(this_03);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)this_03,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_3._4_4_ = 0;
  repfield_3._0_4_ = _internal_extension_range_size(pDStack_78);
  for (; repfield_3._4_4_ < (uint)repfield_3; repfield_3._4_4_ = repfield_3._4_4_ + 1) {
    this_04 = _internal_extension_range(pDStack_78);
    this_05 = RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Get
                        (this_04,repfield_3._4_4_);
    _n_4 = this_05;
    iVar5 = DescriptorProto_ExtensionRange::GetCachedSize(this_05);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (5,(MessageLite *)this_05,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_4._4_4_ = 0;
  repfield_4._0_4_ = _internal_extension_size(pDStack_78);
  for (; repfield_4._4_4_ < (uint)repfield_4; repfield_4._4_4_ = repfield_4._4_4_ + 1) {
    pRVar8 = _internal_extension(pDStack_78);
    pFVar9 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Get(pRVar8,repfield_4._4_4_);
    _n_5 = pFVar9;
    iVar5 = FieldDescriptorProto::GetCachedSize(pFVar9);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (6,(MessageLite *)pFVar9,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 2) != 0) {
    value = (pDStack_78->field_0)._impl_.options_;
    iVar5 = MessageOptions::GetCachedSize((pDStack_78->field_0)._impl_.options_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (7,(MessageLite *)value,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_5._4_4_ = 0;
  repfield_5._0_4_ = _internal_oneof_decl_size(pDStack_78);
  for (; repfield_5._4_4_ < (uint)repfield_5; repfield_5._4_4_ = repfield_5._4_4_ + 1) {
    this_06 = _internal_oneof_decl(pDStack_78);
    this_07 = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::Get
                        (this_06,repfield_5._4_4_);
    _n_6 = this_07;
    iVar5 = OneofDescriptorProto::GetCachedSize(this_07);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (8,(MessageLite *)this_07,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_6._4_4_ = 0;
  repfield_6._0_4_ = _internal_reserved_range_size(pDStack_78);
  for (; repfield_6._4_4_ < (uint)repfield_6; repfield_6._4_4_ = repfield_6._4_4_ + 1) {
    this_08 = _internal_reserved_range(pDStack_78);
    this_09 = RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::Get
                        (this_08,repfield_6._4_4_);
    _n_7 = this_09;
    iVar5 = DescriptorProto_ReservedRange::GetCachedSize(this_09);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (9,(MessageLite *)this_09,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  s._4_4_ = 0;
  s._0_4_ = _internal_reserved_name_size(pDStack_78);
  for (; s._4_4_ < (int)s; s._4_4_ = s._4_4_ + 1) {
    this_10 = _internal_reserved_name_abi_cxx11_(pDStack_78);
    local_128 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(this_10,s._4_4_);
    pcVar7 = (char *)std::__cxx11::string::data();
    iVar5 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_138,"google.protobuf.DescriptorProto.reserved_name");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar7,iVar5,SERIALIZE,local_138);
    pDVar2 = this_;
    local_28 = this_;
    local_2c = 10;
    local_38 = local_128;
    size = (ptrdiff_t)stream_local;
    local_48 = std::__cxx11::string::size();
    pVar3 = size;
    bVar4 = true;
    if ((long)local_48 < 0x80) {
      pp_Var1 = (pDVar2->super_Message).super_MessageLite._vptr_MessageLite;
      iVar5 = io::EpsCopyOutputStream::TagSize(local_2c << 3);
      bVar4 = (long)pp_Var1 + (-(long)iVar5 - pVar3) + 0xf < (long)local_48;
    }
    num = local_2c;
    if (bVar4) {
      s_00 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      local_50 = s_00._M_str;
      this_local = (DescriptorProto *)s_00._M_len;
      local_20 = (EpsCopyOutputStream *)
                 io::EpsCopyOutputStream::WriteStringOutline
                           ((EpsCopyOutputStream *)pDVar2,num,s_00,(uint8_t *)size);
    }
    else {
      local_18 = (byte *)size;
      for (local_c = local_2c << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
        *local_18 = (byte)local_c | 0x80;
        local_18 = local_18 + 1;
      }
      *local_18 = (byte)local_c;
      __dest = local_18 + 2;
      local_18[1] = (byte)local_48;
      size = (ptrdiff_t)__dest;
      local_18 = local_18 + 1;
      __src = (void *)std::__cxx11::string::data();
      memcpy(__dest,__src,local_48);
      local_20 = (EpsCopyOutputStream *)(size + local_48);
    }
    stream_local = local_20;
  }
  if ((_s._4_4_ & 4) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value_00 = _internal_visibility(pDStack_78);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(0xb,value_00,(uint8_t *)stream_local);
  }
  bVar4 = internal::InternalMetadata::have_unknown_fields
                    (&(pDStack_78->super_Message).super_MessageLite._internal_metadata_);
  if (bVar4) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pDStack_78->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL DescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const DescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.DescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_nested_type_size());
       i < n; i++) {
    const auto& repfield = this_._internal_nested_type().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_enum_type_size());
       i < n; i++) {
    const auto& repfield = this_._internal_enum_type().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            4, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_extension_range_size());
       i < n; i++) {
    const auto& repfield = this_._internal_extension_range().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            5, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_extension_size());
       i < n; i++) {
    const auto& repfield = this_._internal_extension().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            6, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        7, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_oneof_decl_size());
       i < n; i++) {
    const auto& repfield = this_._internal_oneof_decl().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            8, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_reserved_range_size());
       i < n; i++) {
    const auto& repfield = this_._internal_reserved_range().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            9, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this_._internal_reserved_name_size(); i < n; ++i) {
    const auto& s = this_._internal_reserved_name().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.DescriptorProto.reserved_name");
    target = stream->WriteString(10, s, target);
  }

  // optional .google.protobuf.SymbolVisibility visibility = 11;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        11, this_._internal_visibility(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto)
  return target;
}